

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O0

string * __thiscall ConfigFile::trim(string *__return_storage_ptr__,ConfigFile *this,string *str)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined8 local_b0 [2];
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_21;
  string *local_20;
  string *str_local;
  ConfigFile *this_local;
  string *tmp;
  
  local_21 = 0;
  local_20 = str;
  str_local = (string *)this;
  this_local = (ConfigFile *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  local_38._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
  local_50 = std::__cxx11::string::begin();
  local_58 = std::__cxx11::string::end();
  local_48 = std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ConfigFile::trim(std::__cxx11::string_const&)::__0>
                       (local_50,local_58);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
  local_78 = std::__cxx11::string::erase(__return_storage_ptr__,local_30,local_40);
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,ConfigFile::trim(std::__cxx11::string_const&)::__1>
            (&local_90,local_98,local_a0);
  local_88._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_90);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
  local_b8._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_b0,&local_b8);
  std::__cxx11::string::erase(__return_storage_ptr__,local_80,local_b0[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string
ConfigFile::trim(const std::string &str) {
  std::string tmp = str;
  tmp.erase(tmp.begin(),
            std::find_if(tmp.begin(), tmp.end(),
                         [](int c) {return !std::isspace(c);}));
  tmp.erase(std::find_if(tmp.rbegin(), tmp.rend(),
                         [](int c) {return !std::isspace(c);})
                .base(),
            tmp.end());

  return tmp;
}